

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-util.c
# Opt level: O2

object * get_random_monster_object(monster_conflict *mon)

{
  object *poVar1;
  _Bool _Var2;
  uint32_t uVar3;
  object **ppoVar4;
  uint32_t m;
  object *poVar5;
  
  ppoVar4 = &mon->held_obj;
  m = 1;
  poVar5 = (object *)0x0;
  do {
    poVar1 = *ppoVar4;
    if (poVar1 == (object *)0x0) {
      return poVar5;
    }
    if (poVar1->artifact == (artifact *)0x0) {
LAB_00174a10:
      uVar3 = Rand_div(m);
      if (uVar3 == 0) {
        poVar5 = poVar1;
      }
      m = m + 1;
    }
    else {
      _Var2 = flag_has_dbg(poVar1->kind->kind_flags,2,5,"obj->kind->kind_flags","KF_QUEST_ART");
      if (!_Var2) goto LAB_00174a10;
    }
    ppoVar4 = &poVar1->next;
  } while( true );
}

Assistant:

struct object *get_random_monster_object(struct monster *mon)
{
    struct object *obj, *pick = NULL;
    int i = 1;

    /* Pick a random object */
    for (obj = mon->held_obj; obj; obj = obj->next)
    {
        /* Check it isn't a quest artifact */
        if (obj->artifact && kf_has(obj->kind->kind_flags, KF_QUEST_ART))
            continue;

        if (one_in_(i)) pick = obj;
        i++;
    }

    return pick;
}